

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall
kj::ExceptionCallback::RootExceptionCallback::onRecoverableException
          (RootExceptionCallback *this,Exception *exception)

{
  uint uVar1;
  Exception *pEVar2;
  ExceptionImpl *this_00;
  Exception *exception_local;
  RootExceptionCallback *this_local;
  
  uVar1 = kj::_::uncaughtExceptionCount();
  if (uVar1 != 0) {
    pEVar2 = mv<kj::Exception>(exception);
    logException(this,ERROR,pEVar2);
    return;
  }
  this_00 = (ExceptionImpl *)__cxa_allocate_exception(0x1b8);
  pEVar2 = mv<kj::Exception>(exception);
  ExceptionImpl::ExceptionImpl(this_00,pEVar2);
  __cxa_throw(this_00,&ExceptionImpl::typeinfo,ExceptionImpl::~ExceptionImpl);
}

Assistant:

void onRecoverableException(Exception&& exception) override {
    if (_::uncaughtExceptionCount() > 0) {
      // Bad time to throw an exception.  Just log instead.
      //
      // TODO(someday): We should really compare uncaughtExceptionCount() against the count at
      //   the innermost runCatchingExceptions() frame in this thread to tell if exceptions are
      //   being caught correctly.
      logException(LogSeverity::ERROR, mv(exception));
    } else {
      throw ExceptionImpl(mv(exception));
    }
  }